

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::SpecifyConditionVisitor::visit<slang::ast::InsideExpression>
          (SpecifyConditionVisitor *this,InsideExpression *expr)

{
  ExpressionKind EVar1;
  int iVar2;
  bool bVar3;
  ulong uVar4;
  Symbol *pSVar5;
  Diagnostic *this_00;
  
  bVar3 = Expression::bad(&expr->super_Expression);
  if (bVar3) {
    return;
  }
  uVar4 = (ulong)(expr->super_Expression).kind;
  if (uVar4 < 0x26) {
    if ((0x20006d9c00U >> (uVar4 & 0x3f) & 1) == 0) {
      if ((6UL >> (uVar4 & 0x3f) & 1) != 0) {
        return;
      }
      if (uVar4 == 8) {
        pSVar5 = Expression::getSymbolReference(&expr->super_Expression,true);
        if (pSVar5 == (Symbol *)0x0) {
          return;
        }
        if (pSVar5->kind - Net < 2) {
          if (pSVar5->parentScope == this->specifyParentScope) {
            return;
          }
        }
        else if (pSVar5->kind == Specparam) {
          return;
        }
        this_00 = ASTContext::addDiag(this->context,(DiagCode)0x980007,
                                      (expr->super_Expression).sourceRange);
        Diagnostic::operator<<(this_00,pSVar5->name);
        Diagnostic::addNote(this_00,(DiagCode)0x50001,pSVar5->location);
        return;
      }
    }
    else {
      InsideExpression::visitExprs<slang::ast::SpecifyConditionVisitor&>(expr,this);
      EVar1 = (expr->super_Expression).kind;
      if (EVar1 == Conversion) {
        if (*(int *)&expr->left_ < 2) {
          return;
        }
      }
      else if (EVar1 == BinaryOp) {
        iVar2 = (int)(expr->rangeList_)._M_extent._M_extent_value;
        if (iVar2 - 5U < 6) {
          return;
        }
        if (iVar2 - 0x13U < 2) {
          return;
        }
      }
      else {
        if (EVar1 != UnaryOp) {
          return;
        }
        if (*(int *)&expr->left_ - 2U < 8) {
          return;
        }
      }
    }
  }
  if (this->hasWarned == false) {
    ASTContext::addDiag(this->context,(DiagCode)0xd60007,(expr->super_Expression).sourceRange);
    this->hasWarned = true;
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            if (expr.bad())
                return;

            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                    if (auto sym = expr.getSymbolReference()) {
                        // Specparams are always allowed.
                        if (sym->kind == SymbolKind::Specparam)
                            break;

                        // Other references must be locally defined nets or variables.
                        if ((sym->kind != SymbolKind::Net && sym->kind != SymbolKind::Variable) ||
                            sym->getParentScope() != specifyParentScope) {
                            auto& diag = context.addDiag(diag::SpecifyPathBadReference,
                                                         expr.sourceRange);
                            diag << sym->name;
                            diag.addNote(diag::NoteDeclarationHere, sym->location);
                        }
                    }
                    break;
                case ExpressionKind::ElementSelect:
                case ExpressionKind::RangeSelect:
                case ExpressionKind::Call:
                case ExpressionKind::MinTypMax:
                case ExpressionKind::Concatenation:
                case ExpressionKind::Replication:
                case ExpressionKind::ConditionalOp:
                case ExpressionKind::UnaryOp:
                case ExpressionKind::BinaryOp:
                case ExpressionKind::Conversion:
                    if constexpr (HasVisitExprs<T, SpecifyConditionVisitor>)
                        expr.visitExprs(*this);

                    if (expr.kind == ExpressionKind::UnaryOp) {
                        switch (expr.template as<UnaryExpression>().op) {
                            case UnaryOperator::BitwiseNot:
                            case UnaryOperator::BitwiseAnd:
                            case UnaryOperator::BitwiseOr:
                            case UnaryOperator::BitwiseXor:
                            case UnaryOperator::BitwiseNand:
                            case UnaryOperator::BitwiseNor:
                            case UnaryOperator::BitwiseXnor:
                            case UnaryOperator::LogicalNot:
                                break;
                            default:
                                reportError(expr.sourceRange);
                        }
                    }
                    else if (expr.kind == ExpressionKind::BinaryOp) {
                        switch (expr.template as<BinaryExpression>().op) {
                            case BinaryOperator::BinaryAnd:
                            case BinaryOperator::BinaryOr:
                            case BinaryOperator::BinaryXor:
                            case BinaryOperator::BinaryXnor:
                            case BinaryOperator::Equality:
                            case BinaryOperator::Inequality:
                            case BinaryOperator::LogicalAnd:
                            case BinaryOperator::LogicalOr:
                                break;
                            default:
                                reportError(expr.sourceRange);
                        }
                    }
                    else if (expr.kind == ExpressionKind::Conversion) {
                        if (!expr.template as<ConversionExpression>().isImplicit())
                            reportError(expr.sourceRange);
                    }
                    break;
                case ExpressionKind::IntegerLiteral:
                case ExpressionKind::RealLiteral:
                    break;
                default:
                    reportError(expr.sourceRange);
                    break;
            }
        }
    }